

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt,int qualified)

{
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  uint local_d4;
  uint local_cc;
  int newSize;
  xmlChar *tmp;
  xmlChar *pxStack_b0;
  int max;
  xmlChar *buffer;
  int local_a0;
  int c;
  int l;
  int len;
  xmlChar buf [105];
  xmlChar *ret;
  int qualified_local;
  xmlXPathParserContextPtr ctxt_local;
  
  c = 0;
  buffer._4_4_ = xmlXPathCurrentChar(ctxt,&local_a0);
  if (buffer._4_4_ == 0x20) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x3e) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x2f) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x5b) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x5d) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x40) {
    return (xmlChar *)0x0;
  }
  if (buffer._4_4_ == 0x2a) {
    return (xmlChar *)0x0;
  }
  if ((int)buffer._4_4_ < 0x100) {
    if (((((0x40 < (int)buffer._4_4_) && ((int)buffer._4_4_ < 0x5b)) ||
         ((0x60 < (int)buffer._4_4_ && ((int)buffer._4_4_ < 0x7b)))) ||
        ((0xbf < (int)buffer._4_4_ && ((int)buffer._4_4_ < 0xd7)))) ||
       (((0xd7 < (int)buffer._4_4_ && ((int)buffer._4_4_ < 0xf7)) || (0xf7 < (int)buffer._4_4_))))
    goto LAB_002292ae;
  }
  else {
    iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsBaseCharGroup);
    if (iVar1 != 0) goto LAB_002292ae;
  }
  if ((((int)buffer._4_4_ < 0x100) ||
      (((((int)buffer._4_4_ < 0x4e00 || (0x9fa5 < (int)buffer._4_4_)) && (buffer._4_4_ != 0x3007))
       && (((int)buffer._4_4_ < 0x3021 || (0x3029 < (int)buffer._4_4_)))))) &&
     (buffer._4_4_ != 0x5f)) {
    if (qualified == 0) {
      return (xmlChar *)0x0;
    }
    if (buffer._4_4_ != 0x3a) {
      return (xmlChar *)0x0;
    }
  }
LAB_002292ae:
  do {
    bVar3 = false;
    if (((buffer._4_4_ != 0x20) && (bVar3 = false, buffer._4_4_ != 0x3e)) &&
       (bVar3 = false, buffer._4_4_ != 0x2f)) {
      if ((int)buffer._4_4_ < 0x100) {
        if ((((((int)buffer._4_4_ < 0x41) || (bVar3 = true, 0x5a < (int)buffer._4_4_)) &&
             ((((int)buffer._4_4_ < 0x61 || (bVar3 = true, 0x7a < (int)buffer._4_4_)) &&
              (((int)buffer._4_4_ < 0xc0 || (bVar3 = true, 0xd6 < (int)buffer._4_4_)))))) &&
            (((int)buffer._4_4_ < 0xd8 || (bVar3 = true, 0xf6 < (int)buffer._4_4_)))) &&
           (bVar3 = true, (int)buffer._4_4_ < 0xf8)) {
LAB_002293cb:
          if (((int)buffer._4_4_ < 0x100) ||
             (((((int)buffer._4_4_ < 0x4e00 || (bVar3 = true, 0x9fa5 < (int)buffer._4_4_)) &&
               (bVar3 = true, buffer._4_4_ != 0x3007)) &&
              (((int)buffer._4_4_ < 0x3021 || (bVar3 = true, 0x3029 < (int)buffer._4_4_)))))) {
            if ((int)buffer._4_4_ < 0x100) {
              if (((int)buffer._4_4_ < 0x30) || (bVar3 = true, 0x39 < (int)buffer._4_4_)) {
LAB_002294a3:
                bVar3 = true;
                if (((buffer._4_4_ != 0x2e) &&
                    ((bVar3 = true, buffer._4_4_ != 0x2d && (bVar3 = true, buffer._4_4_ != 0x5f))))
                   && ((qualified == 0 || (bVar3 = true, buffer._4_4_ != 0x3a)))) {
                  if (0xff < (int)buffer._4_4_) {
                    iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsCombiningGroup);
                    bVar3 = true;
                    if (iVar1 != 0) goto LAB_00229597;
                  }
                  if ((int)buffer._4_4_ < 0x100) {
                    local_cc = (uint)(buffer._4_4_ == 0xb7);
                  }
                  else {
                    local_cc = xmlCharInRange(buffer._4_4_,&xmlIsExtenderGroup);
                  }
                  bVar3 = local_cc != 0;
                }
              }
            }
            else {
              iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsDigitGroup);
              bVar3 = true;
              if (iVar1 == 0) goto LAB_002294a3;
            }
          }
        }
      }
      else {
        iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsBaseCharGroup);
        bVar3 = true;
        if (iVar1 == 0) goto LAB_002293cb;
      }
    }
LAB_00229597:
    if (!bVar3) {
      if (c == 0) {
        return (xmlChar *)0x0;
      }
      register0x00000000 = xmlStrndup((xmlChar *)&l,c);
      if (register0x00000000 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      return stack0xffffffffffffffd8;
    }
    if ((int)buffer._4_4_ < 0x80) {
      *(char *)((long)&l + (long)c) = (char)buffer._4_4_;
      c = c + 1;
    }
    else {
      iVar1 = xmlCopyCharMultiByte((xmlChar *)((long)&l + (long)c),buffer._4_4_);
      c = iVar1 + c;
    }
    ctxt->cur = ctxt->cur + local_a0;
    buffer._4_4_ = xmlXPathCurrentChar(ctxt,&local_a0);
  } while (c < 100);
  tmp._4_4_ = c << 1;
  if (c < 0xc351) {
    pxStack_b0 = (xmlChar *)(*xmlMalloc)((long)tmp._4_4_);
    if (pxStack_b0 != (xmlChar *)0x0) {
      memcpy(pxStack_b0,&l,(long)c);
      do {
        if ((int)buffer._4_4_ < 0x100) {
          if ((((((int)buffer._4_4_ < 0x41) || (bVar3 = true, 0x5a < (int)buffer._4_4_)) &&
               (((int)buffer._4_4_ < 0x61 || (bVar3 = true, 0x7a < (int)buffer._4_4_)))) &&
              ((((int)buffer._4_4_ < 0xc0 || (bVar3 = true, 0xd6 < (int)buffer._4_4_)) &&
               (((int)buffer._4_4_ < 0xd8 || (bVar3 = true, 0xf6 < (int)buffer._4_4_)))))) &&
             (bVar3 = true, (int)buffer._4_4_ < 0xf8)) {
LAB_0022979e:
            if (((int)buffer._4_4_ < 0x100) ||
               (((((int)buffer._4_4_ < 0x4e00 || (bVar3 = true, 0x9fa5 < (int)buffer._4_4_)) &&
                 (bVar3 = true, buffer._4_4_ != 0x3007)) &&
                (((int)buffer._4_4_ < 0x3021 || (bVar3 = true, 0x3029 < (int)buffer._4_4_)))))) {
              if ((int)buffer._4_4_ < 0x100) {
                if (((int)buffer._4_4_ < 0x30) || (bVar3 = true, 0x39 < (int)buffer._4_4_)) {
LAB_00229876:
                  bVar3 = true;
                  if (((buffer._4_4_ != 0x2e) &&
                      ((bVar3 = true, buffer._4_4_ != 0x2d && (bVar3 = true, buffer._4_4_ != 0x5f)))
                      ) && ((qualified == 0 || (bVar3 = true, buffer._4_4_ != 0x3a)))) {
                    if (0xff < (int)buffer._4_4_) {
                      iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsCombiningGroup);
                      bVar3 = true;
                      if (iVar1 != 0) goto LAB_0022995e;
                    }
                    if ((int)buffer._4_4_ < 0x100) {
                      local_d4 = (uint)(buffer._4_4_ == 0xb7);
                    }
                    else {
                      local_d4 = xmlCharInRange(buffer._4_4_,&xmlIsExtenderGroup);
                    }
                    bVar3 = local_d4 != 0;
                  }
                }
              }
              else {
                iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsDigitGroup);
                bVar3 = true;
                if (iVar1 == 0) goto LAB_00229876;
              }
            }
          }
        }
        else {
          iVar1 = xmlCharInRange(buffer._4_4_,&xmlIsBaseCharGroup);
          bVar3 = true;
          if (iVar1 == 0) goto LAB_0022979e;
        }
LAB_0022995e:
        if (!bVar3) {
          pxStack_b0[c] = '\0';
          return pxStack_b0;
        }
        pxVar2 = pxStack_b0;
        if (tmp._4_4_ < c + 10) {
          tmp._4_4_ = xmlGrowCapacity(tmp._4_4_,1,1,50000);
          if (tmp._4_4_ < 0) {
            (*xmlFree)(pxStack_b0);
            xmlXPathErr(ctxt,7);
            return (xmlChar *)0x0;
          }
          pxVar2 = (xmlChar *)(*xmlRealloc)(pxStack_b0,(long)tmp._4_4_);
          if (pxVar2 == (xmlChar *)0x0) {
            (*xmlFree)(pxStack_b0);
            xmlXPathPErrMemory(ctxt);
            return (xmlChar *)0x0;
          }
        }
        pxStack_b0 = pxVar2;
        if ((int)buffer._4_4_ < 0x80) {
          pxStack_b0[c] = (xmlChar)buffer._4_4_;
          c = c + 1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte(pxStack_b0 + c,buffer._4_4_);
          c = iVar1 + c;
        }
        ctxt->cur = ctxt->cur + local_a0;
        buffer._4_4_ = xmlXPathCurrentChar(ctxt,&local_a0);
      } while( true );
    }
    xmlXPathPErrMemory(ctxt);
  }
  else {
    xmlXPathErr(ctxt,7);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt, int qualified) {
    xmlChar *ret;
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;

    /*
     * Handler for more complex cases
     */
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
        (c == '[') || (c == ']') || (c == '@') || /* accelerators */
        (c == '*') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         ((!qualified) || (c != ':')))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || ((qualified) && (c == ':')) ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	COPY_BUF(buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

            if (len > XML_MAX_NAME_LENGTH) {
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
                xmlXPathPErrMemory(ctxt);
                return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while ((IS_LETTER(c)) || (IS_DIGIT(c)) || /* test bigname.xml */
		   (c == '.') || (c == '-') ||
		   (c == '_') || ((qualified) && (c == ':')) ||
		   (IS_COMBINING(c)) ||
		   (IS_EXTENDER(c))) {
		if (len + 10 > max) {
                    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_NAME_LENGTH);
                    if (newSize < 0) {
                        xmlFree(buffer);
                        xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
                        xmlFree(buffer);
                        xmlXPathPErrMemory(ctxt);
                        return(NULL);
		    }
                    buffer = tmp;
		    max = newSize;
		}
		COPY_BUF(buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
	return(NULL);
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    return(ret);
}